

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O0

int i2d_SSL_SESSION(SSL_SESSION *in,uchar **pp)

{
  int iVar1;
  ulong local_30;
  size_t len;
  uint8_t *out;
  uint8_t **pp_local;
  SSL_SESSION *in_local;
  
  out = (uint8_t *)pp;
  pp_local = (uint8_t **)in;
  iVar1 = SSL_SESSION_to_bytes((SSL_SESSION *)in,(uint8_t **)&len,&local_30);
  if (iVar1 == 0) {
    in_local._4_4_ = -1;
  }
  else if (local_30 < 0x80000000) {
    if (out != (uint8_t *)0x0) {
      OPENSSL_memcpy(*(void **)out,(void *)len,local_30);
      *(ulong *)out = local_30 + *(long *)out;
    }
    OPENSSL_free((void *)len);
    in_local._4_4_ = (int)local_30;
  }
  else {
    OPENSSL_free((void *)len);
    ERR_put_error(0x10,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                  ,0x300);
    in_local._4_4_ = -1;
  }
  return in_local._4_4_;
}

Assistant:

int i2d_SSL_SESSION(SSL_SESSION *in, uint8_t **pp) {
  uint8_t *out;
  size_t len;

  if (!SSL_SESSION_to_bytes(in, &out, &len)) {
    return -1;
  }

  if (len > INT_MAX) {
    OPENSSL_free(out);
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return -1;
  }

  if (pp) {
    OPENSSL_memcpy(*pp, out, len);
    *pp += len;
  }
  OPENSSL_free(out);

  return len;
}